

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void parse_block(Parser *psr)

{
  Lexer *lxr;
  int iVar1;
  int iVar2;
  uint uVar3;
  FnScope *pFVar4;
  Function *pFVar5;
  BcIns *pBVar6;
  uint64_t uVar7;
  SavedLexer saved;
  bool bVar8;
  int iVar9;
  int iVar10;
  Node *left;
  Tk binop;
  NodeType head_idx;
  long lVar11;
  Node NVar12;
  int jmp_head;
  undefined1 local_70 [12];
  NodeType NStack_64;
  int local_60;
  int iStack_5c;
  anon_union_8_2_0c43866c_for_TkInfo_4 aStack_58;
  Node local_50;
  Node local_40;
  
  iVar1 = psr->locals_count;
  iVar2 = psr->scope->next_slot;
  lxr = &psr->lxr;
LAB_00110cc6:
  iVar9 = (psr->lxr).tk.type;
  switch(iVar9) {
  case 0x10c:
    lex_next(lxr);
    lex_expect(lxr,0x114);
    uVar7 = (psr->lxr).tk.field_4.ident_hash;
    iVar9 = psr->scope->first_local;
    lVar11 = (long)iVar9;
    if (iVar9 < psr->locals_count) {
      do {
        if (psr->locals[lVar11].name == uVar7) {
          psr_trigger_err(psr,"variable already defined");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x573,"void parse_let(Parser *)");
        }
        lVar11 = lVar11 + 1;
      } while (psr->locals_count != lVar11);
    }
    lex_next(lxr);
    lex_expect(lxr,0x3d);
    lex_next(lxr);
    NVar12 = parse_subexpr(psr,PREC_NONE);
    register0x00000010 = NVar12.field_1;
    local_70._0_4_ = NVar12.type;
    expr_to_next_slot(psr,(Node *)local_70);
    psr_new_local(psr,uVar7);
    goto LAB_00110cc6;
  case 0x10d:
    local_50.type = ~NODE_NUM;
    do {
      lex_next(lxr);
      NVar12 = parse_subexpr(psr,PREC_NONE);
      register0x00000010 = NVar12.field_1;
      local_70._0_4_ = NVar12.type;
      expr_to_jmp(psr,(Node *)local_70);
      jmp_ensure_true_falls_through(psr,(Node *)local_70);
      jmp_list_patch(psr,local_70._8_4_,psr->vm->fns[psr->scope->fn].ins_count);
      lex_expect(lxr,0x7b);
      lex_next(lxr);
      parse_block(psr);
      lex_expect(lxr,0x7d);
      lex_next(lxr);
      if (((psr->lxr).tk.type & 0xfffffffeU) == 0x10e) {
        iVar9 = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
        jmp_list_append(psr,(int *)&local_50,iVar9);
      }
      jmp_list_patch(psr,NStack_64,psr->vm->fns[psr->scope->fn].ins_count);
      iVar9 = (psr->lxr).tk.type;
    } while (iVar9 == 0x10f);
    if (iVar9 == 0x10e) {
      lex_next(lxr);
      lex_expect(lxr,0x7b);
      lex_next(lxr);
      parse_block(psr);
      lex_expect(lxr,0x7d);
      lex_next(lxr);
    }
    iVar9 = psr->vm->fns[psr->scope->fn].ins_count;
    head_idx = local_50.type;
    break;
  case 0x110:
    lex_next(lxr);
    iVar9 = psr->vm->fns[psr->scope->fn].ins_count;
    lex_expect(lxr,0x7b);
    lex_next(lxr);
    parse_block(psr);
    lex_expect(lxr,0x7d);
    lex_next(lxr);
    iVar10 = fn_emit(psr->vm->fns + psr->scope->fn,0x1e);
    pBVar6 = psr->vm->fns[psr->scope->fn].ins;
    pBVar6[iVar10] = (uint)(byte)pBVar6[iVar10] + (iVar9 - iVar10) * 0x100 + 0x7fffff00;
    goto LAB_00110cc6;
  case 0x111:
    lex_next(lxr);
    iVar9 = psr->vm->fns[psr->scope->fn].ins_count;
    NVar12 = parse_subexpr(psr,PREC_NONE);
    register0x00000010 = NVar12.field_1;
    local_70._0_4_ = NVar12.type;
    expr_to_jmp(psr,(Node *)local_70);
    jmp_ensure_true_falls_through(psr,(Node *)local_70);
    jmp_list_patch(psr,local_70._8_4_,psr->vm->fns[psr->scope->fn].ins_count);
    lex_expect(lxr,0x7b);
    lex_next(lxr);
    parse_block(psr);
    lex_expect(lxr,0x7d);
    lex_next(lxr);
    iVar10 = fn_emit(psr->vm->fns + psr->scope->fn,0x1e);
    pFVar4 = psr->scope;
    pFVar5 = psr->vm->fns;
    pBVar6 = pFVar5[pFVar4->fn].ins;
    pBVar6[iVar10] = (uint)(byte)pBVar6[iVar10] + (iVar9 - iVar10) * 0x100 + 0x7fffff00;
    iVar9 = pFVar5[pFVar4->fn].ins_count;
    head_idx = NStack_64;
    break;
  case 0x113:
    lex_next(lxr);
    lex_expect(lxr,0x114);
    uVar7 = (psr->lxr).tk.field_4.ident_hash;
    lex_next(lxr);
    iVar9 = parse_fn_args_body(psr);
    psr_new_local(psr,uVar7);
    pFVar4 = psr->scope;
    uVar3 = pFVar4->next_slot;
    pFVar4->next_slot = uVar3 + 1;
    fn_emit(psr->vm->fns + pFVar4->fn,(uVar3 & 0xff) * 0x100 + iVar9 * 0x10000 + 3);
    goto LAB_00110cc6;
  case 0x114:
    lex_save((SavedLexer *)local_70,lxr);
    lex_next(lxr);
    iVar9 = (psr->lxr).tk.type;
    saved.line = local_70._4_4_;
    saved.cursor = local_70._0_4_;
    saved.tk._0_8_ = stack0xffffffffffffff98;
    saved.tk.length = local_60;
    saved.tk.line = iStack_5c;
    saved.tk.field_4.num = aStack_58.num;
    lex_restore(lxr,saved);
    if ((iVar9 - 0x101U < 5) || (iVar9 == 0x3d)) {
      uVar7 = (psr->lxr).tk.field_4.ident_hash;
      lex_next(lxr);
      iVar9 = psr->scope->first_local;
      if (psr->locals_count <= iVar9) {
LAB_00111293:
        psr_trigger_err(psr,"variable not defined");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x533,"void parse_assign(Parser *)");
      }
      lVar11 = 0;
      while (psr->locals[iVar9 + lVar11].name != uVar7) {
        lVar11 = lVar11 + 1;
        if ((long)psr->locals_count - (long)iVar9 == lVar11) goto LAB_00111293;
      }
      if ((int)lVar11 == -1) goto LAB_00111293;
      binop = 0;
      switch((psr->lxr).tk.type) {
      case 0x101:
        binop = 0x2b;
        break;
      case 0x102:
        binop = 0x2d;
        break;
      case 0x103:
        binop = 0x2a;
        break;
      case 0x104:
        binop = 0x2f;
        break;
      default:
        bVar8 = true;
        goto LAB_001111fd;
      }
      bVar8 = false;
LAB_001111fd:
      lex_next(lxr);
      NVar12 = parse_subexpr(psr,PREC_NONE);
      local_50.field_1 = NVar12.field_1;
      local_50.type = NVar12.type;
      if (bVar8) {
        left = &local_50;
      }
      else {
        local_40.type = NODE_NON_RELOC;
        left = &local_40;
        NVar12._4_4_ = 0;
        NVar12.type = local_50.type;
        NVar12.field_1 = local_50.field_1;
        local_40.field_1.slot = (uint8_t)lVar11;
        expr_emit_arith(psr,binop,left,NVar12);
      }
      expr_to_slot(psr,(uint8_t)lVar11,left);
    }
    else {
      parse_subexpr(psr,PREC_NONE);
    }
    goto LAB_00110cc6;
  default:
    if (iVar9 == 0x28) goto code_r0x00110d77;
  case 0x10e:
  case 0x10f:
  case 0x112:
    psr->locals_count = iVar1;
    psr->scope->next_slot = iVar2;
    return;
  }
  jmp_list_patch(psr,head_idx,iVar9);
  goto LAB_00110cc6;
code_r0x00110d77:
  parse_subexpr(psr,PREC_NONE);
  goto LAB_00110cc6;
}

Assistant:

static void parse_block(Parser *psr) {
	// Save the initial number of locals and the next slot, so we can discard
	// the locals created in this block once we reach the end of it
	int locals_count = psr->locals_count;
	int next_slot = psr->scope->next_slot;

	// Continually parse statements
	bool have_statement = true;
	while (have_statement) {
		switch (psr->lxr.tk.type) {
			case TK_LET:   parse_let(psr); break;
			case TK_IDENT: parse_assign_or_expr(psr); break;
			case '(':      parse_expr(psr); break;
			case TK_IF:    parse_if(psr); break;
			case TK_LOOP:  parse_loop(psr); break;
			case TK_WHILE: parse_while(psr); break;
			case TK_FN:    parse_fn(psr); break;

			// Couldn't find a statement to parse
		default:
			have_statement = false;
			break;
		}
	}

	// Discard all locals created in this block
	psr->locals_count = locals_count;
	psr->scope->next_slot = next_slot;
}